

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O3

SSL_CIPHER * __thiscall
bssl::ssl_choose_tls13_cipher
          (bssl *this,CBS cipher_suites,bool has_aes_hw,uint16_t version,
          ssl_compliance_policy_t policy)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  SSL_CIPHER *cipher;
  undefined7 in_register_00000009;
  undefined2 in_register_00000082;
  undefined ***pppuVar6;
  SSL_CIPHER *pSVar7;
  uint16_t cipher_suite;
  CNsaCipherScorer cnsa_scorer;
  AesHwCipherScorer aes_hw_scorer;
  uint16_t local_66;
  ssl_compliance_policy_t local_64;
  ulong local_60;
  CBS local_58;
  undefined **local_48;
  undefined **local_40;
  undefined1 local_38;
  
  local_64 = CONCAT22(in_register_00000082,version);
  local_58.len = (size_t)cipher_suites.data;
  if (((undefined1  [16])cipher_suites & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar1 = (ushort)CONCAT71(in_register_00000009,has_aes_hw);
    local_40 = &PTR__CipherScorer_004327c0;
    local_38 = (undefined1)cipher_suites.len;
    local_48 = &PTR__CipherScorer_00432810;
    pppuVar6 = &local_40;
    if (local_64 == ssl_compliance_policy_cnsa_202407) {
      pppuVar6 = &local_48;
    }
    if ((uint8_t *)local_58.len != (uint8_t *)0x0) {
      local_60 = 0;
      pSVar7 = (SSL_CIPHER *)0x0;
      local_58.data = (uint8_t *)this;
      while (iVar4 = CBS_get_u16(&local_58,&local_66), iVar4 != 0) {
        cipher = SSL_get_cipher_by_value(local_66);
        if (((cipher != (SSL_CIPHER *)0x0) &&
            (uVar3 = SSL_CIPHER_get_min_version(cipher), uVar3 <= uVar1)) &&
           (uVar3 = SSL_CIPHER_get_max_version(cipher), uVar1 <= uVar3)) {
          uVar3 = SSL_CIPHER_get_protocol_id(cipher);
          bVar2 = ssl_tls13_cipher_meets_policy(uVar3,local_64);
          if (bVar2) {
            uVar5 = (*(code *)(*pppuVar6)[2])(pppuVar6,cipher);
            iVar4 = (int)local_60;
            local_60 = local_60 & 0xffffffff;
            if (iVar4 < (int)uVar5) {
              local_60 = (ulong)uVar5;
              pSVar7 = cipher;
            }
          }
        }
        if ((uint8_t *)local_58.len == (uint8_t *)0x0) {
          return pSVar7;
        }
      }
    }
  }
  return (SSL_CIPHER *)0x0;
}

Assistant:

const SSL_CIPHER *ssl_choose_tls13_cipher(CBS cipher_suites, bool has_aes_hw,
                                          uint16_t version,
                                          enum ssl_compliance_policy_t policy) {
  if (CBS_len(&cipher_suites) % 2 != 0) {
    return nullptr;
  }

  const SSL_CIPHER *best = nullptr;
  AesHwCipherScorer aes_hw_scorer(has_aes_hw);
  CNsaCipherScorer cnsa_scorer;
  CipherScorer *const scorer =
      (policy == ssl_compliance_policy_cnsa_202407)
          ? static_cast<CipherScorer *>(&cnsa_scorer)
          : static_cast<CipherScorer *>(&aes_hw_scorer);
  CipherScorer::Score best_score = CipherScorer::kMinScore;

  while (CBS_len(&cipher_suites) > 0) {
    uint16_t cipher_suite;
    if (!CBS_get_u16(&cipher_suites, &cipher_suite)) {
      return nullptr;
    }

    // Limit to TLS 1.3 ciphers we know about.
    const SSL_CIPHER *candidate = SSL_get_cipher_by_value(cipher_suite);
    if (candidate == nullptr ||
        SSL_CIPHER_get_min_version(candidate) > version ||
        SSL_CIPHER_get_max_version(candidate) < version) {
      continue;
    }

    if (!ssl_tls13_cipher_meets_policy(SSL_CIPHER_get_protocol_id(candidate),
                                       policy)) {
      continue;
    }

    const CipherScorer::Score candidate_score = scorer->Evaluate(candidate);
    // |candidate_score| must be larger to displace the current choice. That way
    // the client's order controls between ciphers with an equal score.
    if (candidate_score > best_score) {
      best = candidate;
      best_score = candidate_score;
    }
  }

  return best;
}